

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall
SimpleString::split(SimpleString *this,SimpleString *delimiter,SimpleStringCollection *col)

{
  bool bVar1;
  char *s2;
  char *pcVar2;
  SimpleString *pSVar3;
  SimpleString local_88 [2];
  SimpleString local_68;
  SimpleString local_58;
  ulong local_48;
  size_t i;
  char *prev;
  char *str;
  size_t extraEndToken;
  size_t num;
  SimpleStringCollection *col_local;
  SimpleString *delimiter_local;
  SimpleString *this_local;
  
  num = (size_t)col;
  col_local = (SimpleStringCollection *)delimiter;
  delimiter_local = this;
  extraEndToken = count(this,delimiter);
  bVar1 = endsWith(this,(SimpleString *)col_local);
  str = (char *)(ulong)!bVar1;
  SimpleStringCollection::allocate((SimpleStringCollection *)num,(size_t)(str + extraEndToken));
  prev = getBuffer(this);
  for (local_48 = 0; pcVar2 = prev, local_48 < extraEndToken; local_48 = local_48 + 1) {
    i = (size_t)prev;
    s2 = getBuffer((SimpleString *)col_local);
    pcVar2 = StrStr(pcVar2,s2);
    prev = pcVar2 + 1;
    SimpleString(&local_68,(char *)i);
    subString(&local_58,(size_t)&local_68,0);
    pSVar3 = SimpleStringCollection::operator[]((SimpleStringCollection *)num,local_48);
    operator=(pSVar3,&local_58);
    ~SimpleString(&local_58);
    ~SimpleString(&local_68);
  }
  if (str != (char *)0x0) {
    SimpleString(local_88,prev);
    pSVar3 = SimpleStringCollection::operator[]((SimpleStringCollection *)num,extraEndToken);
    operator=(pSVar3,local_88);
    ~SimpleString(local_88);
  }
  return;
}

Assistant:

void SimpleString::split(const SimpleString& delimiter, SimpleStringCollection& col) const
{
    size_t num = count(delimiter);
    size_t extraEndToken = (endsWith(delimiter)) ? 0 : 1U;
    col.allocate(num + extraEndToken);

    const char* str = getBuffer();
    const char* prev;
    for (size_t i = 0; i < num; ++i) {
        prev = str;
        str = StrStr(str, delimiter.getBuffer()) + 1;
        col[i] = SimpleString(prev).subString(0, size_t (str - prev));
    }
    if (extraEndToken) {
        col[num] = str;
    }
}